

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O3

Error * ot::commissioner::CommissionerImpl::EncodeActiveOperationalDataset
                  (Error *__return_storage_ptr__,Request *aRequest,
                  ActiveOperationalDataset *aDataset)

{
  string *this;
  ushort uVar1;
  ErrorCode EVar2;
  uint64_t aValue;
  bool bVar3;
  ByteArray value;
  Tlv local_a0;
  undefined1 local_80 [8];
  _Alloc_hider local_78;
  char local_68 [16];
  ByteArray local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  __return_storage_ptr__->mCode = kNone;
  this = &__return_storage_ptr__->mMessage;
  local_38 = &(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)local_38;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  uVar1 = aDataset->mPresentFlags;
  if ((short)uVar1 < 0) {
    aValue = Timestamp::Encode(&aDataset->mActiveTimestamp);
    tlv::Tlv::Tlv(&local_a0,kActiveTimestamp,aValue,kMeshCoP);
    AppendTlv((Error *)local_80,aRequest,&local_a0);
    __return_storage_ptr__->mCode = local_80._0_4_;
    std::__cxx11::string::operator=((string *)this,(string *)&local_78);
    EVar2 = __return_storage_ptr__->mCode;
    if (local_78._M_p != local_68) {
      operator_delete(local_78._M_p);
    }
    if (local_a0.mValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a0.mValue.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (EVar2 != kNone) {
      return __return_storage_ptr__;
    }
    uVar1 = aDataset->mPresentFlags;
  }
  if ((uVar1 >> 0xe & 1) != 0) {
    local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    utils::Encode<unsigned_char>(&local_58,(aDataset->mChannel).mPage);
    utils::Encode<unsigned_short>(&local_58,(aDataset->mChannel).mNumber);
    tlv::Tlv::Tlv(&local_a0,kChannel,&local_58,kMeshCoP);
    AppendTlv((Error *)local_80,aRequest,&local_a0);
    __return_storage_ptr__->mCode = local_80._0_4_;
    std::__cxx11::string::operator=((string *)this,(string *)&local_78);
    EVar2 = __return_storage_ptr__->mCode;
    if (local_78._M_p != local_68) {
      operator_delete(local_78._M_p);
    }
    if (local_a0.mValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a0.mValue.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (EVar2 != kNone) {
      return __return_storage_ptr__;
    }
    uVar1 = aDataset->mPresentFlags;
  }
  if ((uVar1 >> 0xd & 1) != 0) {
    local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    EncodeChannelMask((Error *)local_80,&local_58,&aDataset->mChannelMask);
    __return_storage_ptr__->mCode = local_80._0_4_;
    std::__cxx11::string::operator=((string *)this,(string *)&local_78);
    EVar2 = __return_storage_ptr__->mCode;
    if (local_78._M_p != local_68) {
      operator_delete(local_78._M_p);
    }
    if (EVar2 == kNone) {
      tlv::Tlv::Tlv(&local_a0,kChannelMask,&local_58,kMeshCoP);
      AppendTlv((Error *)local_80,aRequest,&local_a0);
      __return_storage_ptr__->mCode = local_80._0_4_;
      std::__cxx11::string::operator=((string *)this,(string *)&local_78);
      bVar3 = __return_storage_ptr__->mCode == kNone;
      if (local_78._M_p != local_68) {
        operator_delete(local_78._M_p);
      }
      if (local_a0.mValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a0.mValue.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    else {
      bVar3 = false;
    }
    if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (!bVar3) {
      return __return_storage_ptr__;
    }
    uVar1 = aDataset->mPresentFlags;
  }
  if ((uVar1 >> 0xc & 1) != 0) {
    tlv::Tlv::Tlv(&local_a0,kExtendedPanId,&aDataset->mExtendedPanId,kMeshCoP);
    AppendTlv((Error *)local_80,aRequest,&local_a0);
    __return_storage_ptr__->mCode = local_80._0_4_;
    std::__cxx11::string::operator=((string *)this,(string *)&local_78);
    EVar2 = __return_storage_ptr__->mCode;
    if (local_78._M_p != local_68) {
      operator_delete(local_78._M_p);
    }
    if (local_a0.mValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a0.mValue.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (EVar2 != kNone) {
      return __return_storage_ptr__;
    }
    uVar1 = aDataset->mPresentFlags;
  }
  if ((uVar1 >> 0xb & 1) != 0) {
    tlv::Tlv::Tlv(&local_a0,kNetworkDiagNetworkData,&aDataset->mMeshLocalPrefix,kMeshCoP);
    AppendTlv((Error *)local_80,aRequest,&local_a0);
    __return_storage_ptr__->mCode = local_80._0_4_;
    std::__cxx11::string::operator=((string *)this,(string *)&local_78);
    EVar2 = __return_storage_ptr__->mCode;
    if (local_78._M_p != local_68) {
      operator_delete(local_78._M_p);
    }
    if (local_a0.mValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a0.mValue.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (EVar2 != kNone) {
      return __return_storage_ptr__;
    }
    uVar1 = aDataset->mPresentFlags;
  }
  if ((uVar1 >> 10 & 1) != 0) {
    tlv::Tlv::Tlv(&local_a0,kNetworkDiagRoute64,&aDataset->mNetworkMasterKey,kMeshCoP);
    AppendTlv((Error *)local_80,aRequest,&local_a0);
    __return_storage_ptr__->mCode = local_80._0_4_;
    std::__cxx11::string::operator=((string *)this,(string *)&local_78);
    EVar2 = __return_storage_ptr__->mCode;
    if (local_78._M_p != local_68) {
      operator_delete(local_78._M_p);
    }
    if (local_a0.mValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a0.mValue.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (EVar2 != kNone) {
      return __return_storage_ptr__;
    }
    uVar1 = aDataset->mPresentFlags;
  }
  if ((uVar1 >> 9 & 1) != 0) {
    tlv::Tlv::Tlv(&local_a0,kNetworkDiagTimeout,&aDataset->mNetworkName,kMeshCoP);
    AppendTlv((Error *)local_80,aRequest,&local_a0);
    __return_storage_ptr__->mCode = local_80._0_4_;
    std::__cxx11::string::operator=((string *)this,(string *)&local_78);
    EVar2 = __return_storage_ptr__->mCode;
    if (local_78._M_p != local_68) {
      operator_delete(local_78._M_p);
    }
    if (local_a0.mValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a0.mValue.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (EVar2 != kNone) {
      return __return_storage_ptr__;
    }
    uVar1 = aDataset->mPresentFlags;
  }
  if ((uVar1 >> 8 & 1) != 0) {
    tlv::Tlv::Tlv(&local_a0,kNetworkDiagMacAddress,aDataset->mPanId,kMeshCoP);
    AppendTlv((Error *)local_80,aRequest,&local_a0);
    __return_storage_ptr__->mCode = local_80._0_4_;
    std::__cxx11::string::operator=((string *)this,(string *)&local_78);
    EVar2 = __return_storage_ptr__->mCode;
    if (local_78._M_p != local_68) {
      operator_delete(local_78._M_p);
    }
    if (local_a0.mValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a0.mValue.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (EVar2 != kNone) {
      return __return_storage_ptr__;
    }
    uVar1 = aDataset->mPresentFlags;
  }
  if ((char)uVar1 < '\0') {
    tlv::Tlv::Tlv(&local_a0,kNetworkDiagConnectivity,&aDataset->mPSKc,kMeshCoP);
    AppendTlv((Error *)local_80,aRequest,&local_a0);
    __return_storage_ptr__->mCode = local_80._0_4_;
    std::__cxx11::string::operator=((string *)this,(string *)&local_78);
    EVar2 = __return_storage_ptr__->mCode;
    if (local_78._M_p != local_68) {
      operator_delete(local_78._M_p);
    }
    if (local_a0.mValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a0.mValue.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (EVar2 != kNone) {
      return __return_storage_ptr__;
    }
    uVar1 = aDataset->mPresentFlags;
  }
  if ((uVar1 & 0x40) != 0) {
    local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    utils::Encode<unsigned_short>(&local_58,(aDataset->mSecurityPolicy).mRotationTime);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_58,
               local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish,
               (aDataset->mSecurityPolicy).mFlags.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start);
    tlv::Tlv::Tlv(&local_a0,kSecurityPolicy,&local_58,kMeshCoP);
    AppendTlv((Error *)local_80,aRequest,&local_a0);
    __return_storage_ptr__->mCode = local_80._0_4_;
    std::__cxx11::string::operator=((string *)this,(string *)&local_78);
    if (local_78._M_p != local_68) {
      operator_delete(local_78._M_p);
    }
    if (local_a0.mValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a0.mValue.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerImpl::EncodeActiveOperationalDataset(coap::Request                  &aRequest,
                                                       const ActiveOperationalDataset &aDataset)
{
    Error error;

    if (aDataset.mPresentFlags & ActiveOperationalDataset::kActiveTimestampBit)
    {
        SuccessOrExit(error = AppendTlv(aRequest, {tlv::Type::kActiveTimestamp, aDataset.mActiveTimestamp.Encode()}));
    }

    if (aDataset.mPresentFlags & ActiveOperationalDataset::kChannelBit)
    {
        ByteArray value;
        utils::Encode(value, aDataset.mChannel.mPage);
        utils::Encode(value, aDataset.mChannel.mNumber);
        SuccessOrExit(error = AppendTlv(aRequest, {tlv::Type::kChannel, value}));
    }

    if (aDataset.mPresentFlags & ActiveOperationalDataset::kChannelMaskBit)
    {
        ByteArray value;
        SuccessOrExit(error = EncodeChannelMask(value, aDataset.mChannelMask));
        SuccessOrExit(error = AppendTlv(aRequest, {tlv::Type::kChannelMask, value}));
    }

    if (aDataset.mPresentFlags & ActiveOperationalDataset::kExtendedPanIdBit)
    {
        SuccessOrExit(error = AppendTlv(aRequest, {tlv::Type::kExtendedPanId, aDataset.mExtendedPanId}));
    }

    if (aDataset.mPresentFlags & ActiveOperationalDataset::kMeshLocalPrefixBit)
    {
        SuccessOrExit(error = AppendTlv(aRequest, {tlv::Type::kNetworkMeshLocalPrefix, aDataset.mMeshLocalPrefix}));
    }

    if (aDataset.mPresentFlags & ActiveOperationalDataset::kNetworkMasterKeyBit)
    {
        SuccessOrExit(error = AppendTlv(aRequest, {tlv::Type::kNetworkMasterKey, aDataset.mNetworkMasterKey}));
    }

    if (aDataset.mPresentFlags & ActiveOperationalDataset::kNetworkNameBit)
    {
        SuccessOrExit(error = AppendTlv(aRequest, {tlv::Type::kNetworkName, aDataset.mNetworkName}));
    }

    if (aDataset.mPresentFlags & ActiveOperationalDataset::kPanIdBit)
    {
        SuccessOrExit(error = AppendTlv(aRequest, {tlv::Type::kPanId, aDataset.mPanId}));
    }

    if (aDataset.mPresentFlags & ActiveOperationalDataset::kPSKcBit)
    {
        SuccessOrExit(error = AppendTlv(aRequest, {tlv::Type::kPSKc, aDataset.mPSKc}));
    }

    if (aDataset.mPresentFlags & ActiveOperationalDataset::kSecurityPolicyBit)
    {
        ByteArray value;
        utils::Encode(value, aDataset.mSecurityPolicy.mRotationTime);
        value.insert(value.end(), aDataset.mSecurityPolicy.mFlags.begin(), aDataset.mSecurityPolicy.mFlags.end());
        SuccessOrExit(error = AppendTlv(aRequest, {tlv::Type::kSecurityPolicy, value}));
    }

exit:
    return error;
}